

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O3

GLFWwindow * create_window(GLFWmonitor *monitor)

{
  GLFWvidmode *pGVar1;
  GLFWwindow *handle;
  int height;
  int width;
  
  if (monitor == (GLFWmonitor *)0x0) {
    width = 0x280;
    height = 0x1e0;
  }
  else {
    pGVar1 = glfwGetVideoMode(monitor);
    glfwWindowHint(0x2100f,pGVar1->refreshRate);
    glfwWindowHint(0x21001,pGVar1->redBits);
    glfwWindowHint(0x21002,pGVar1->greenBits);
    glfwWindowHint(0x21003,pGVar1->blueBits);
    width = pGVar1->width;
    height = pGVar1->height;
  }
  handle = glfwCreateWindow(width,height,"Iconify",monitor,(GLFWwindow *)0x0);
  if (handle != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(handle);
    gladLoadGL(glfwGetProcAddress);
    return handle;
  }
  glfwTerminate();
  exit(1);
}

Assistant:

static GLFWwindow* create_window(GLFWmonitor* monitor)
{
    int width, height;
    GLFWwindow* window;

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);
        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    window = glfwCreateWindow(width, height, "Iconify", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    return window;
}